

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

string * Json::StyledStreamWriter::normalizeEOL(string *__return_storage_ptr__,string *text)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (text->_M_string_length != 0) {
    pcVar1 = (text->_M_dataplus)._M_p;
    pcVar3 = pcVar1 + text->_M_string_length;
    do {
      pcVar2 = pcVar1 + 1;
      if (*pcVar1 == '\r') {
        if (pcVar1[1] == '\n') {
          pcVar2 = pcVar1 + 2;
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        pcVar1 = pcVar2;
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        pcVar1 = pcVar2;
      }
    } while (pcVar1 != pcVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StyledStreamWriter::normalizeEOL(const std::string& text) {
  std::string normalized;
  normalized.reserve(text.length());
  const char* begin = text.c_str();
  const char* end = begin + text.length();
  const char* current = begin;
  while (current != end) {
    char c = *current++;
    if (c == '\r') // mac or dos EOL
    {
      if (*current == '\n') // convert dos EOL
        ++current;
      normalized += '\n';
    } else // handle unix EOL & other char
      normalized += c;
  }
  return normalized;
}